

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

wasm_val_t FromWabtValue(Store *store,TypedValue *tv)

{
  FILE *pFVar1;
  Enum EVar2;
  undefined8 uVar3;
  undefined4 extraout_var;
  s64 sVar4;
  s64 extraout_RAX;
  s64 extraout_RAX_00;
  s64 extraout_RAX_01;
  s64 extraout_RAX_02;
  TypedValue *in_RDX;
  wasm_val_t wVar5;
  RefPtr<wabt::interp::Foreign> local_90;
  Ref local_78;
  Ref ref_1;
  RefPtr<wabt::interp::Func> local_68;
  Ref local_50;
  Ref ref;
  TypedValue *tv_local;
  Store *store_local;
  wasm_val_t out_value;
  
  pFVar1 = _stderr;
  wabt::interp::TypedValueToString_abi_cxx11_((string *)&ref,(interp *)tv,in_RDX);
  uVar3 = std::__cxx11::string::c_str();
  fprintf(pFVar1,"CAPI: [%s] %s\n","FromWabtValue",uVar3);
  std::__cxx11::string::~string((string *)&ref);
  EVar2 = wabt::Type::operator_cast_to_Enum(&tv->type);
  pFVar1 = _stderr;
  switch(EVar2) {
  case ExternRef:
    local_78 = wabt::interp::Value::Get<wabt::interp::Ref>(&tv->value);
    store_local._0_1_ = 0x80;
    out_value._0_8_ = operator_new(0x18);
    wabt::interp::Store::UnsafeGet<wabt::interp::Foreign>(&local_90,store,local_78);
    wasm_foreign_t::wasm_foreign_t((wasm_foreign_t *)out_value._0_8_,&local_90);
    wabt::interp::RefPtr<wabt::interp::Foreign>::~RefPtr(&local_90);
    sVar4 = extraout_RAX_02;
    break;
  case FuncRef:
    local_50 = wabt::interp::Value::Get<wabt::interp::Ref>(&tv->value);
    store_local._0_1_ = 0x81;
    out_value._0_8_ = operator_new(0x18);
    ref_1.index = local_50.index;
    wabt::interp::Store::UnsafeGet<wabt::interp::Func>(&local_68,store,local_50);
    wasm_func_t::wasm_func_t((wasm_func_t *)out_value._0_8_,&local_68);
    wabt::interp::RefPtr<wabt::interp::Func>::~RefPtr(&local_68);
    sVar4 = extraout_RAX_01;
    break;
  default:
    EVar2 = wabt::Type::operator_cast_to_Enum(&tv->type);
    fprintf(pFVar1,"CAPI: [%s] unexpected wabt type: %d\n","FromWabtValue",(ulong)(uint)EVar2);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp-wasm-c-api.cc"
                  ,0x1d6,"wasm_val_t FromWabtValue(Store &, const TypedValue &)");
  case F64:
    store_local._0_1_ = 3;
    out_value._0_8_ = wabt::interp::Value::Get<double>(&tv->value);
    sVar4 = extraout_RAX_00;
    break;
  case F32:
    store_local._0_1_ = 2;
    out_value._0_4_ = wabt::interp::Value::Get<float>(&tv->value);
    sVar4 = extraout_RAX;
    break;
  case I64:
    store_local._0_1_ = 1;
    sVar4 = wabt::interp::Value::Get<long>(&tv->value);
    out_value._0_8_ = sVar4;
    break;
  case I32:
    store_local._0_1_ = 0;
    out_value._0_4_ = wabt::interp::Value::Get<int>(&tv->value);
    sVar4 = CONCAT44(extraout_var,out_value._0_4_);
  }
  wVar5._1_7_ = (undefined7)((ulong)sVar4 >> 8);
  wVar5.kind = store_local._0_1_;
  wVar5.of = (anon_union_8_5_30786955_for_of)out_value._0_8_;
  return wVar5;
}

Assistant:

static wasm_val_t FromWabtValue(Store& store, const TypedValue& tv) {
  TRACE("%s", TypedValueToString(tv).c_str());
  wasm_val_t out_value;
  switch (tv.type) {
    case Type::I32:
      out_value.kind = WASM_I32;
      out_value.of.i32 = tv.value.Get<s32>();
      break;
    case Type::I64:
      out_value.kind = WASM_I64;
      out_value.of.i64 = tv.value.Get<s64>();
      break;
    case Type::F32:
      out_value.kind = WASM_F32;
      out_value.of.f32 = tv.value.Get<f32>();
      break;
    case Type::F64:
      out_value.kind = WASM_F64;
      out_value.of.f64 = tv.value.Get<f64>();
      break;
    case Type::FuncRef: {
      Ref ref = tv.value.Get<Ref>();
      out_value.kind = WASM_FUNCREF;
      out_value.of.ref = new wasm_func_t(store.UnsafeGet<Func>(ref));
      break;
    }
    case Type::ExternRef: {
      Ref ref = tv.value.Get<Ref>();
      out_value.kind = WASM_ANYREF;
      out_value.of.ref = new wasm_foreign_t(store.UnsafeGet<Foreign>(ref));
      break;
    }
    default:
      TRACE("unexpected wabt type: %d", static_cast<int>(tv.type));
      assert(false);
  }
  return out_value;
}